

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans.h
# Opt level: O0

int __thiscall draco::RAnsEncoder<15>::write_end(RAnsEncoder<15> *this)

{
  int iVar1;
  uint uVar2;
  long *in_RDI;
  uint32_t state;
  int local_4;
  
  iVar1 = *(int *)((long)in_RDI + 0xc);
  uVar2 = iVar1 - 0x20000;
  if (uVar2 < 0x40) {
    *(char *)(*in_RDI + (long)(int)in_RDI[1]) = (char)uVar2;
    local_4 = (int)in_RDI[1] + 1;
  }
  else if (uVar2 < 0x4000) {
    mem_put_le16((void *)(*in_RDI + (long)(int)in_RDI[1]),iVar1 - 0x1c000);
    local_4 = (int)in_RDI[1] + 2;
  }
  else if (uVar2 < 0x400000) {
    mem_put_le24((void *)(*in_RDI + (long)(int)in_RDI[1]),iVar1 + 0x7e0000);
    local_4 = (int)in_RDI[1] + 3;
  }
  else if (uVar2 < 0x40000000) {
    mem_put_le32((void *)(*in_RDI + (long)(int)in_RDI[1]),iVar1 + 0xbffe0000);
    local_4 = (int)in_RDI[1] + 4;
  }
  else {
    local_4 = (int)in_RDI[1];
  }
  return local_4;
}

Assistant:

inline int write_end() {
    uint32_t state;
    DRACO_DCHECK_GE(ans_.state, l_rans_base);
    DRACO_DCHECK_LT(ans_.state, l_rans_base * DRACO_ANS_IO_BASE);
    state = ans_.state - l_rans_base;
    if (state < (1 << 6)) {
      ans_.buf[ans_.buf_offset] = (0x00 << 6) + state;
      return ans_.buf_offset + 1;
    } else if (state < (1 << 14)) {
      mem_put_le16(ans_.buf + ans_.buf_offset, (0x01 << 14) + state);
      return ans_.buf_offset + 2;
    } else if (state < (1 << 22)) {
      mem_put_le24(ans_.buf + ans_.buf_offset, (0x02 << 22) + state);
      return ans_.buf_offset + 3;
    } else if (state < (1 << 30)) {
      mem_put_le32(ans_.buf + ans_.buf_offset, (0x03u << 30u) + state);
      return ans_.buf_offset + 4;
    } else {
      DRACO_DCHECK(0 && "State is too large to be serialized");
      return ans_.buf_offset;
    }
  }